

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

void __thiscall llvm::raw_fd_ostream::write_impl(raw_fd_ostream *this,char *Ptr,size_t Size)

{
  int iVar1;
  bool bVar2;
  ssize_t sVar3;
  int *piVar4;
  error_category *peVar5;
  size_t __n;
  
  if (-1 < this->FD) {
    this->pos = this->pos + Size;
    do {
      __n = 0x40000000;
      if (Size < 0x40000000) {
        __n = Size;
      }
      sVar3 = write(this->FD,Ptr,__n);
      if (sVar3 < 0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        bVar2 = false;
        if ((iVar1 != 4) && (iVar1 != 0xb)) {
          peVar5 = (error_category *)std::_V2::generic_category();
          (this->EC)._M_value = iVar1;
          (this->EC)._M_cat = peVar5;
          bVar2 = true;
        }
      }
      else {
        Ptr = Ptr + sVar3;
        Size = Size - sVar3;
        bVar2 = false;
      }
    } while ((Size != 0) && (!bVar2));
    return;
  }
  __assert_fail("FD >= 0 && \"File already closed.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x265,"virtual void llvm::raw_fd_ostream::write_impl(const char *, size_t)");
}

Assistant:

void raw_fd_ostream::write_impl(const char *Ptr, size_t Size) {
  assert(FD >= 0 && "File already closed.");
  pos += Size;

  // The maximum write size is limited to INT32_MAX. A write
  // greater than SSIZE_MAX is implementation-defined in POSIX,
  // and Windows _write requires 32 bit input.
  size_t MaxWriteSize = INT32_MAX;

#if defined(__linux__)
  // It is observed that Linux returns EINVAL for a very large write (>2G).
  // Make it a reasonably small value.
  MaxWriteSize = 1024 * 1024 * 1024;
#elif defined(_WIN32)
  // Writing a large size of output to Windows console returns ENOMEM. It seems
  // that, prior to Windows 8, WriteFile() is redirecting to WriteConsole(), and
  // the latter has a size limit (66000 bytes or less, depending on heap usage).
  if (::_isatty(FD) && !RunningWindows8OrGreater())
    MaxWriteSize = 32767;
#endif

  do {
    size_t ChunkSize = std::min(Size, MaxWriteSize);
    ssize_t ret = ::write(FD, Ptr, ChunkSize);

    if (ret < 0) {
      // If it's a recoverable error, swallow it and retry the write.
      //
      // Ideally we wouldn't ever see EAGAIN or EWOULDBLOCK here, since
      // raw_ostream isn't designed to do non-blocking I/O. However, some
      // programs, such as old versions of bjam, have mistakenly used
      // O_NONBLOCK. For compatibility, emulate blocking semantics by
      // spinning until the write succeeds. If you don't want spinning,
      // don't use O_NONBLOCK file descriptors with raw_ostream.
      if (errno == EINTR || errno == EAGAIN
#ifdef EWOULDBLOCK
          || errno == EWOULDBLOCK
#endif
          )
        continue;

      // Otherwise it's a non-recoverable error. Note it and quit.
      error_detected(std::error_code(errno, std::generic_category()));
      break;
    }

    // The write may have written some or all of the data. Update the
    // size and buffer pointer to reflect the remainder that needs
    // to be written. If there are no bytes left, we're done.
    Ptr += ret;
    Size -= ret;
  } while (Size > 0);
}